

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O3

ostream * fasttext::utils::operator<<(ostream *out,ClockPrint *me)

{
  int iVar1;
  short sVar2;
  int iVar3;
  ostream *poVar4;
  uint uVar5;
  short sVar6;
  
  iVar1 = me->duration_;
  iVar3 = iVar1 % 0xe10;
  sVar2 = (short)iVar3;
  uVar5 = ((uint)(sVar2 * -0x7777) >> 0x10) + iVar3;
  sVar6 = ((short)uVar5 >> 5) + (short)((uVar5 & 0xffff) >> 0xf);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 3;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)out,iVar1 / 0xe10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"h",1);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)sVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"m",1);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 2;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)out,(int)(short)(sVar2 + sVar6 * -0x3c));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"s",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ClockPrint& me) {
  int32_t etah = me.duration_ / 3600;
  int32_t etam = (me.duration_ % 3600) / 60;
  int32_t etas = (me.duration_ % 3600) % 60;

  out << std::setw(3) << etah << "h" << std::setw(2) << etam << "m";
  out << std::setw(2) << etas << "s";
  return out;
}